

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]magic_enum/test/3rdparty/Catch2/include/catch2/catch.hpp:9778:35)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_test_3rdparty_Catch2_include_catch2_catch_hpp:9778:35)>
          *this,string *arg)

{
  bool bVar1;
  Verbosity VVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string lcVerbosity;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  BasicResult<Catch::clara::detail::ParseResultType> local_48;
  
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&temp,arg);
  local_48.m_errorMessage._M_dataplus._M_p = (pointer)&local_48.m_errorMessage.field_2;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.m_type = Ok
  ;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001a6ed8;
  local_48.m_errorMessage._M_string_length = 0;
  local_48.m_errorMessage.field_2._M_local_buf[0] = '\0';
  toLower(&lcVerbosity,&temp);
  bVar1 = ::std::operator==(&lcVerbosity,"quiet");
  VVar2 = Quiet;
  if (!bVar1) {
    bVar1 = ::std::operator==(&lcVerbosity,"normal");
    if (bVar1) {
      VVar2 = Normal;
    }
    else {
      bVar1 = ::std::operator==(&lcVerbosity,"high");
      if (!bVar1) {
        ::std::operator+(&local_88,"Unrecognised verbosity, \'",&temp);
        ::std::operator+(&local_68,&local_88,"\'");
        BasicResult<Catch::clara::detail::ParseResultType>::runtimeError
                  (__return_storage_ptr__,&local_68);
        ::std::__cxx11::string::~string((string *)&local_68);
        ::std::__cxx11::string::~string((string *)&local_88);
        goto LAB_001423cd;
      }
      VVar2 = High;
    }
  }
  ((this->m_lambda).config)->verbosity = VVar2;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001a6ed8;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_001423cd:
  ::std::__cxx11::string::~string((string *)&lcVerbosity);
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&local_48);
  ::std::__cxx11::string::~string((string *)&temp);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }